

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.hpp
# Opt level: O0

DomainInsideSignature * __thiscall
TasGrid::TasmanianSparseGrid::getDomainInside
          (DomainInsideSignature *__return_storage_ptr__,TasmanianSparseGrid *this)

{
  bool bVar1;
  int iVar2;
  anon_class_16_2_3f0543ac local_58;
  size_t local_48;
  size_t dims_1;
  anon_class_16_2_3f0543ac local_38;
  size_t local_28;
  size_t dims;
  TasmanianSparseGrid *pTStack_18;
  TypeOneDRule rule;
  TasmanianSparseGrid *this_local;
  
  pTStack_18 = this;
  this_local = (TasmanianSparseGrid *)__return_storage_ptr__;
  dims._4_4_ = TasGrid::TasmanianSparseGrid::getRule();
  if ((dims._4_4_ == 0x22) || (dims._4_4_ == 0x23)) {
    std::function<bool(std::vector<double,std::allocator<double>>const&)>::
    function<TasGrid::TasmanianSparseGrid::getDomainInside()const::_lambda(std::vector<double,std::allocator<double>>const&)_1_,void>
              ((function<bool(std::vector<double,std::allocator<double>>const&)> *)
               __return_storage_ptr__,(anon_class_1_0_00000001 *)((long)&dims + 3));
  }
  else if ((dims._4_4_ == 0x20) || (dims._4_4_ == 0x21)) {
    bVar1 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)(this + 0x10));
    if (bVar1) {
      std::function<bool(std::vector<double,std::allocator<double>>const&)>::
      function<TasGrid::TasmanianSparseGrid::getDomainInside()const::_lambda(std::vector<double,std::allocator<double>>const&)_2_,void>
                ((function<bool(std::vector<double,std::allocator<double>>const&)> *)
                 __return_storage_ptr__,(anon_class_1_0_00000001 *)((long)&dims + 2));
    }
    else {
      iVar2 = getNumDimensions(this);
      local_38.dims = (size_t)iVar2;
      local_38.this = this;
      local_28 = local_38.dims;
      std::function<bool(std::vector<double,std::allocator<double>>const&)>::
      function<TasGrid::TasmanianSparseGrid::getDomainInside()const::_lambda(std::vector<double,std::allocator<double>>const&)_3_,void>
                ((function<bool(std::vector<double,std::allocator<double>>const&)> *)
                 __return_storage_ptr__,&local_38);
    }
  }
  else {
    bVar1 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)(this + 0x10));
    if (bVar1) {
      bVar1 = isFourier(this);
      if (bVar1) {
        std::function<bool(std::vector<double,std::allocator<double>>const&)>::
        function<TasGrid::TasmanianSparseGrid::getDomainInside()const::_lambda(std::vector<double,std::allocator<double>>const&)_4_,void>
                  ((function<bool(std::vector<double,std::allocator<double>>const&)> *)
                   __return_storage_ptr__,(anon_class_1_0_00000001 *)((long)&dims_1 + 7));
      }
      else {
        std::function<bool(std::vector<double,std::allocator<double>>const&)>::
        function<TasGrid::TasmanianSparseGrid::getDomainInside()const::_lambda(std::vector<double,std::allocator<double>>const&)_5_,void>
                  ((function<bool(std::vector<double,std::allocator<double>>const&)> *)
                   __return_storage_ptr__,(anon_class_1_0_00000001 *)((long)&dims_1 + 6));
      }
    }
    else {
      iVar2 = getNumDimensions(this);
      local_58.dims = (size_t)iVar2;
      local_58.this = this;
      local_48 = local_58.dims;
      std::function<bool(std::vector<double,std::allocator<double>>const&)>::
      function<TasGrid::TasmanianSparseGrid::getDomainInside()const::_lambda(std::vector<double,std::allocator<double>>const&)_6_,void>
                ((function<bool(std::vector<double,std::allocator<double>>const&)> *)
                 __return_storage_ptr__,&local_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

DomainInsideSignature getDomainInside() const{
        auto rule = getRule();
        if ((rule == TasGrid::rule_gausshermite) || (rule == TasGrid::rule_gausshermiteodd)){ // unbounded domain
            return [](std::vector<double> const &)->bool{ return true; };
        }else if ((rule == TasGrid::rule_gausslaguerre) || (rule == TasGrid::rule_gausslaguerreodd)){ // bounded from below
            if (domain_transform_a.empty()){
                return [](std::vector<double> const &x)->bool{
                    for(auto const &v : x) if (v < 0.0) return false;
                    return true;
                };
            }else{
                size_t dims = (size_t) getNumDimensions();
                return [=](std::vector<double> const &x)->bool{
                    for(size_t i=0; i<dims; i++) if (x[i] < domain_transform_a[i]) return false;
                    return true;
                };
            }
        }else{
            if (domain_transform_a.empty()){
                if (isFourier()){
                    return [](std::vector<double> const &x)->bool{
                        for(auto const &v : x) if ((v < 0.0) || (v > 1.0)) return false;
                        return true;
                    };
                }else{
                    return [](std::vector<double> const &x)->bool{
                        for(auto const &v : x) if ((v < -1.0) || (v > 1.0)) return false;
                        return true;
                    };
                }
            }else{
                size_t dims = (size_t) getNumDimensions();
                return [=](std::vector<double> const &x)->bool{
                    for(size_t i=0; i<dims; i++)
                        if ((x[i] < domain_transform_a[i]) || (x[i] > domain_transform_b[i])) return false;
                    return true;
                };
            }
        }
    }